

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O1

void R_3D_DeleteHeights(void)

{
  HeightLevel *block;
  
  height_cur = height_top;
  if (height_top != (HeightLevel *)0x0) {
    do {
      height_top = height_cur;
      block = height_cur;
      height_cur = height_cur->next;
      M_Free(block);
    } while (height_cur != (HeightLevel *)0x0);
  }
  height_max = -1;
  height_cur = (HeightLevel *)0x0;
  height_top = (HeightLevel *)0x0;
  return;
}

Assistant:

void R_3D_DeleteHeights()
{
	height_cur = height_top;
	while(height_cur) {
		height_top = height_cur;
		height_cur = height_cur->next;
		M_Free(height_top);
	}
	height_max = -1;
	height_top = height_cur = NULL;
}